

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_mp3dec_f32_to_s16(float *in,ma_int16 *out,size_t num_samples)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar11;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  long in_RDI;
  float fVar12;
  undefined1 auVar13 [16];
  size_t i;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  ulong local_198;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  short s;
  float sample;
  __m128i pcm8;
  ma_dr_mp3_f4 s16min;
  ma_dr_mp3_f4 s16max;
  ma_dr_mp3_f4 b;
  ma_dr_mp3_f4 a;
  ma_dr_mp3_f4 scale;
  size_t aligned_count;
  
  for (local_198 = 0; local_198 < (CONCAT62(in_register_00000012,in_DX) & 0xfffffffffffffff8);
      local_198 = local_198 + 8) {
    puVar1 = (undefined8 *)(in_RDI + local_198 * 4);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    local_e8 = (float)uVar2;
    fStack_e4 = (float)((ulong)uVar2 >> 0x20);
    fStack_e0 = (float)uVar3;
    fStack_dc = (float)((ulong)uVar3 >> 0x20);
    puVar1 = (undefined8 *)(in_RDI + 0x10 + local_198 * 4);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    local_108 = (float)uVar2;
    fStack_104 = (float)((ulong)uVar2 >> 0x20);
    fStack_100 = (float)uVar3;
    fStack_fc = (float)((ulong)uVar3 >> 0x20);
    auVar10._4_4_ = fStack_e4 * 32768.0;
    auVar10._0_4_ = local_e8 * 32768.0;
    auVar10._12_4_ = fStack_dc * 32768.0;
    auVar10._8_4_ = fStack_e0 * 32768.0;
    auVar9._8_8_ = 0x46fffe0046fffe00;
    auVar9._0_8_ = 0x46fffe0046fffe00;
    auVar13 = minps(auVar10,auVar9);
    auVar6._8_8_ = 0xc7000000c7000000;
    auVar6._0_8_ = 0xc7000000c7000000;
    auVar13 = maxps(auVar13,auVar6);
    local_98 = auVar13._0_4_;
    fStack_94 = auVar13._4_4_;
    fStack_90 = auVar13._8_4_;
    fStack_8c = auVar13._12_4_;
    auVar8._4_4_ = fStack_104 * 32768.0;
    auVar8._0_4_ = local_108 * 32768.0;
    auVar8._12_4_ = fStack_fc * 32768.0;
    auVar8._8_4_ = fStack_100 * 32768.0;
    auVar7._8_8_ = 0x46fffe0046fffe00;
    auVar7._0_8_ = 0x46fffe0046fffe00;
    auVar13 = minps(auVar8,auVar7);
    auVar5._8_8_ = 0xc7000000c7000000;
    auVar5._0_8_ = 0xc7000000c7000000;
    auVar13 = maxps(auVar13,auVar5);
    local_a8 = auVar13._0_4_;
    fStack_a4 = auVar13._4_4_;
    fStack_a0 = auVar13._8_4_;
    fStack_9c = auVar13._12_4_;
    auVar4._4_4_ = (int)fStack_94;
    auVar4._0_4_ = (int)local_98;
    auVar4._8_4_ = (int)fStack_90;
    auVar4._12_4_ = (int)fStack_8c;
    auVar13._4_4_ = (int)fStack_a4;
    auVar13._0_4_ = (int)local_a8;
    auVar13._8_4_ = (int)fStack_a0;
    auVar13._12_4_ = (int)fStack_9c;
    auVar13 = packssdw(auVar4,auVar13);
    *(short *)(in_RSI + local_198 * 2) = auVar13._0_2_;
    uStack_206 = auVar13._2_2_;
    *(undefined2 *)(in_RSI + 2 + local_198 * 2) = uStack_206;
    uStack_204 = auVar13._4_2_;
    *(undefined2 *)(in_RSI + 4 + local_198 * 2) = uStack_204;
    uStack_202 = auVar13._6_2_;
    *(undefined2 *)(in_RSI + 6 + local_198 * 2) = uStack_202;
    uStack_200 = auVar13._8_2_;
    *(undefined2 *)(in_RSI + 8 + local_198 * 2) = uStack_200;
    uStack_1fe = auVar13._10_2_;
    *(undefined2 *)(in_RSI + 10 + local_198 * 2) = uStack_1fe;
    uStack_1fc = auVar13._12_2_;
    *(undefined2 *)(in_RSI + 0xc + local_198 * 2) = uStack_1fc;
    uStack_1fa = auVar13._14_2_;
    *(undefined2 *)(in_RSI + 0xe + local_198 * 2) = uStack_1fa;
  }
  for (; local_198 < CONCAT62(in_register_00000012,in_DX); local_198 = local_198 + 1) {
    fVar12 = *(float *)(in_RDI + local_198 * 4) * 32768.0;
    if (fVar12 < 32766.5) {
      if (-32767.5 < fVar12) {
        sVar11 = (short)(int)(fVar12 + 0.5);
        *(ushort *)(in_RSI + local_198 * 2) = sVar11 - (ushort)(sVar11 < 0);
      }
      else {
        *(undefined2 *)(in_RSI + local_198 * 2) = 0x8000;
      }
    }
    else {
      *(undefined2 *)(in_RSI + local_198 * 2) = 0x7fff;
    }
  }
  return;
}

Assistant:

MA_API void ma_dr_mp3dec_f32_to_s16(const float *in, ma_int16 *out, size_t num_samples)
{
    size_t i = 0;
#if MA_DR_MP3_HAVE_SIMD
    size_t aligned_count = num_samples & ~7;
    for(; i < aligned_count; i+=8)
    {
        ma_dr_mp3_f4 scale = MA_DR_MP3_VSET(32768.0f);
        ma_dr_mp3_f4 a = MA_DR_MP3_VMUL(MA_DR_MP3_VLD(&in[i  ]), scale);
        ma_dr_mp3_f4 b = MA_DR_MP3_VMUL(MA_DR_MP3_VLD(&in[i+4]), scale);
#if MA_DR_MP3_HAVE_SSE
        ma_dr_mp3_f4 s16max = MA_DR_MP3_VSET( 32767.0f);
        ma_dr_mp3_f4 s16min = MA_DR_MP3_VSET(-32768.0f);
        __m128i pcm8 = _mm_packs_epi32(_mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(a, s16max), s16min)),
                                        _mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(b, s16max), s16min)));
        out[i  ] = (ma_int16)_mm_extract_epi16(pcm8, 0);
        out[i+1] = (ma_int16)_mm_extract_epi16(pcm8, 1);
        out[i+2] = (ma_int16)_mm_extract_epi16(pcm8, 2);
        out[i+3] = (ma_int16)_mm_extract_epi16(pcm8, 3);
        out[i+4] = (ma_int16)_mm_extract_epi16(pcm8, 4);
        out[i+5] = (ma_int16)_mm_extract_epi16(pcm8, 5);
        out[i+6] = (ma_int16)_mm_extract_epi16(pcm8, 6);
        out[i+7] = (ma_int16)_mm_extract_epi16(pcm8, 7);
#else
        int16x4_t pcma, pcmb;
        a = MA_DR_MP3_VADD(a, MA_DR_MP3_VSET(0.5f));
        b = MA_DR_MP3_VADD(b, MA_DR_MP3_VSET(0.5f));
        pcma = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(a), vreinterpretq_s32_u32(vcltq_f32(a, MA_DR_MP3_VSET(0)))));
        pcmb = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(b), vreinterpretq_s32_u32(vcltq_f32(b, MA_DR_MP3_VSET(0)))));
        vst1_lane_s16(out+i  , pcma, 0);
        vst1_lane_s16(out+i+1, pcma, 1);
        vst1_lane_s16(out+i+2, pcma, 2);
        vst1_lane_s16(out+i+3, pcma, 3);
        vst1_lane_s16(out+i+4, pcmb, 0);
        vst1_lane_s16(out+i+5, pcmb, 1);
        vst1_lane_s16(out+i+6, pcmb, 2);
        vst1_lane_s16(out+i+7, pcmb, 3);
#endif
    }
#endif
    for(; i < num_samples; i++)
    {
        float sample = in[i] * 32768.0f;
        if (sample >=  32766.5f)
            out[i] = (ma_int16) 32767;
        else if (sample <= -32767.5f)
            out[i] = (ma_int16)-32768;
        else
        {
            short s = (ma_int16)(sample + .5f);
            s -= (s < 0);
            out[i] = s;
        }
    }
}